

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void ImPlot::PlotVLines<int>(char *label_id,int *xs,int count,int offset,int stride)

{
  ImPlotContext *pIVar1;
  bool bVar2;
  ImU32 col;
  ImDrawList *DrawList;
  int i;
  int iVar3;
  ImPlotPoint IVar4;
  TransformerLinLin local_94;
  GetterXsYRef<int> get_min;
  GetterXsYRef<int> get_max;
  ImPlotLimits lims;
  
  iVar3 = 0;
  bVar2 = BeginItem(label_id,0);
  if (bVar2) {
    GetPlotLimits(&lims,-1);
    get_min.YRef = lims.Y.Min;
    if (count != 0) {
      iVar3 = (offset % count + count) % count;
    }
    get_max.YRef = lims.Y.Max;
    if (count == 0) {
      get_max.Offset = 0;
    }
    else {
      get_max.Offset = (offset % count + count) % count;
    }
    get_min.Xs = xs;
    get_min.Count = count;
    get_min.Offset = iVar3;
    get_min.Stride = stride;
    get_max.Xs = xs;
    get_max.Count = count;
    get_max.Stride = stride;
    if (GImPlot->FitThisFrame == true) {
      for (iVar3 = 0; iVar3 < get_min.Count; iVar3 = iVar3 + 1) {
        IVar4 = GetterXsYRef<int>::operator()(&get_min,iVar3);
        FitPointX(IVar4.x);
      }
    }
    pIVar1 = GImPlot;
    DrawList = GetPlotDrawList();
    if ((pIVar1->NextItemData).RenderLine == true) {
      col = ImGui::GetColorU32((pIVar1->NextItemData).Colors);
      iVar3 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar3]) {
      case 0:
        local_94.YAxis = iVar3;
        RenderLineSegments<ImPlot::GetterXsYRef<int>,ImPlot::GetterXsYRef<int>,ImPlot::TransformerLinLin>
                  (&get_min,&get_max,&local_94,DrawList,(pIVar1->NextItemData).LineWeight,col);
        break;
      case 1:
        local_94.YAxis = iVar3;
        RenderLineSegments<ImPlot::GetterXsYRef<int>,ImPlot::GetterXsYRef<int>,ImPlot::TransformerLogLin>
                  (&get_min,&get_max,(TransformerLogLin *)&local_94,DrawList,
                   (pIVar1->NextItemData).LineWeight,col);
        break;
      case 2:
        local_94.YAxis = iVar3;
        RenderLineSegments<ImPlot::GetterXsYRef<int>,ImPlot::GetterXsYRef<int>,ImPlot::TransformerLinLog>
                  (&get_min,&get_max,(TransformerLinLog *)&local_94,DrawList,
                   (pIVar1->NextItemData).LineWeight,col);
        break;
      case 3:
        local_94.YAxis = iVar3;
        RenderLineSegments<ImPlot::GetterXsYRef<int>,ImPlot::GetterXsYRef<int>,ImPlot::TransformerLogLog>
                  (&get_min,&get_max,(TransformerLogLog *)&local_94,DrawList,
                   (pIVar1->NextItemData).LineWeight,col);
      }
    }
    EndItem();
  }
  return;
}

Assistant:

void PlotVLines(const char* label_id, const T* xs, int count, int offset, int stride) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        const ImPlotLimits lims = GetPlotLimits();
        GetterXsYRef<T> get_min(xs,lims.Y.Min,count,offset,stride);
        GetterXsYRef<T> get_max(xs,lims.Y.Max,count,offset,stride);
        if (FitThisFrame()) {
            for (int i = 0; i < get_min.Count; ++i)
                FitPointX(get_min(i).x);
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render stems
        if (s.RenderLine) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderLineSegments(get_min, get_max, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderLineSegments(get_min, get_max, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderLineSegments(get_min, get_max, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderLineSegments(get_min, get_max, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        EndItem();
    }
}